

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_smr(REF_DBL *metric0,REF_DBL *metric1,REF_DBL *metric,REF_GRID ref_grid)

{
  REF_DBL *m;
  REF_DBL *m2;
  double dVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL n_vectors [9];
  REF_DBL n_values [3];
  REF_DBL metric_inv [6];
  REF_DBL diagonal_system [12];
  REF_DBL inv_n_vectors [9];
  REF_DBL inv_m1_m2 [9];
  
  lVar4 = 0;
  do {
    if (ref_grid->node->max <= lVar4) {
      return 0;
    }
    if (-1 < ref_grid->node->global[lVar4]) {
      m = metric0 + lVar4 * 6;
      uVar2 = ref_matrix_inv_m(m,metric_inv);
      if (uVar2 != 0) {
        pcVar7 = "inv";
        uVar5 = 0x712;
        goto LAB_00186208;
      }
      m2 = metric1 + lVar4 * 6;
      uVar2 = ref_matrix_mult_m(metric_inv,m2,inv_m1_m2);
      if (uVar2 != 0) {
        pcVar7 = "mult";
        uVar5 = 0x713;
LAB_00186260:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar5,"ref_metric_smr",(ulong)uVar2,pcVar7);
        return uVar2;
      }
      uVar2 = ref_matrix_diag_gen(3,inv_m1_m2,n_values,n_vectors);
      if (uVar2 != 0) {
        pcVar7 = "gen eig";
        uVar5 = 0x714;
        goto LAB_00186260;
      }
      pdVar8 = n_vectors + 2;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar9 = pdVar8[-2];
        dVar10 = pdVar8[-1];
        dVar11 = *pdVar8;
        dVar9 = (m[5] * dVar11 + m[2] * dVar9 + dVar10 * m[4]) * dVar11 +
                (m[2] * dVar11 + *m * dVar9 + m[1] * dVar10) * dVar9 +
                (m[4] * dVar11 + m[1] * dVar9 + m[3] * dVar10) * dVar10;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar10 = dVar9 * 1e+20;
        if (dVar10 <= -dVar10) {
          dVar10 = -dVar10;
        }
        if (dVar10 <= 1.0) {
          pcVar7 = "inf h0";
          RVar3 = 4;
          uVar5 = 0x717;
          goto LAB_001861c3;
        }
        dVar10 = pdVar8[-2];
        dVar11 = pdVar8[-1];
        dVar1 = *pdVar8;
        dVar10 = (m2[5] * dVar1 + m2[2] * dVar10 + dVar11 * m2[4]) * dVar1 +
                 (m2[2] * dVar1 + *m2 * dVar10 + m2[1] * dVar11) * dVar10 +
                 (m2[4] * dVar1 + m2[1] * dVar10 + m2[3] * dVar11) * dVar11;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar11 = dVar10 * 1e+20;
        if (dVar11 <= -dVar11) {
          dVar11 = -dVar11;
        }
        if (dVar11 <= 1.0) {
          pcVar7 = "inf h1";
          RVar3 = 4;
          uVar5 = 0x71a;
          goto LAB_001861c3;
        }
        dVar11 = (1.0 / dVar9) * 4.0;
        dVar9 = (1.0 / dVar9) * 0.25;
        if (dVar9 <= 1.0 / dVar10) {
          dVar9 = 1.0 / dVar10;
        }
        if (dVar9 <= dVar11) {
          dVar11 = dVar9;
        }
        dVar9 = dVar11 * dVar11 * 1e+20;
        if (dVar9 <= -dVar9) {
          dVar9 = -dVar9;
        }
        if (dVar9 <= 1.0) {
          pcVar7 = "zero h^2";
          RVar3 = 4;
          uVar5 = 0x720;
          goto LAB_001861c3;
        }
        diagonal_system[lVar6] = 1.0 / (dVar11 * dVar11);
        pdVar8 = pdVar8 + 3;
      }
      RVar3 = ref_matrix_inv_gen(3,n_vectors,inv_n_vectors);
      if (RVar3 != 0) {
        puts(" unable to invert eigenvectors:");
        printf(" %f %f %f\n",n_vectors[0],n_vectors[1],n_vectors[2]);
        printf(" %f %f %f\n",n_vectors[3],n_vectors[4],n_vectors[5]);
        printf(" %f %f %f\n",n_vectors[6],n_vectors[7],n_vectors[8]);
        pcVar7 = "gen eig";
        RVar3 = 1;
        uVar5 = 0x729;
LAB_001861c3:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar5,"ref_metric_smr",RVar3,pcVar7);
        return RVar3;
      }
      uVar2 = ref_matrix_transpose_gen(3,inv_n_vectors,diagonal_system + 3);
      if (uVar2 != 0) {
        pcVar7 = "gen eig";
        uVar5 = 0x72c;
LAB_00186208:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar5,"ref_metric_smr",(ulong)uVar2,pcVar7);
        return uVar2;
      }
      uVar2 = ref_matrix_form_m(diagonal_system,metric + lVar4 * 6);
      if (uVar2 != 0) {
        pcVar7 = "reform m";
        uVar5 = 0x72d;
        goto LAB_00186208;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_smr(REF_DBL *metric0, REF_DBL *metric1,
                                  REF_DBL *metric, REF_GRID ref_grid) {
  REF_INT node;
  REF_DBL metric_inv[6];
  REF_DBL inv_m1_m2[9];
  REF_DBL n_values[3], n_vectors[9], inv_n_vectors[9];
  REF_DBL diagonal_system[12];
  REF_DBL h0, h1, h, hmax, hmin, h2;
  REF_DBL eig;
  REF_INT i;

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_inv_m(&(metric0[6 * node]), metric_inv), "inv");
    RSS(ref_matrix_mult_m(metric_inv, &(metric1[6 * node]), inv_m1_m2), "mult");
    RSS(ref_matrix_diag_gen(3, inv_m1_m2, n_values, n_vectors), "gen eig");
    for (i = 0; i < 3; i++) {
      h0 = ref_matrix_sqrt_vt_m_v(&(metric0[6 * node]), &(n_vectors[i * 3]));
      if (!ref_math_divisible(1.0, h0)) RSS(REF_DIV_ZERO, "inf h0");
      h0 = 1.0 / h0;
      h1 = ref_matrix_sqrt_vt_m_v(&(metric1[6 * node]), &(n_vectors[i * 3]));
      if (!ref_math_divisible(1.0, h1)) RSS(REF_DIV_ZERO, "inf h1");
      h1 = 1.0 / h1;
      hmax = 4.00 * h0;
      hmin = 0.25 * h0;
      h = MIN(hmax, MAX(hmin, h1));
      h2 = h * h;
      if (!ref_math_divisible(1.0, h2)) RSS(REF_DIV_ZERO, "zero h^2");
      eig = 1.0 / h2;
      ref_matrix_eig(diagonal_system, i) = eig;
    }
    if (REF_SUCCESS != ref_matrix_inv_gen(3, n_vectors, inv_n_vectors)) {
      printf(" unable to invert eigenvectors:\n");
      printf(" %f %f %f\n", n_vectors[0], n_vectors[1], n_vectors[2]);
      printf(" %f %f %f\n", n_vectors[3], n_vectors[4], n_vectors[5]);
      printf(" %f %f %f\n", n_vectors[6], n_vectors[7], n_vectors[8]);
      RSS(REF_FAILURE, "gen eig");
    }
    RSS(ref_matrix_transpose_gen(3, inv_n_vectors, &(diagonal_system[3])),
        "gen eig");
    RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "reform m");
  }

  return REF_SUCCESS;
}